

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uniset.cpp
# Opt level: O2

UBool __thiscall icu_63::UnicodeSet::containsNone(UnicodeSet *this,UnicodeSet *c)

{
  UChar32 *pUVar1;
  ulong uVar2;
  UBool UVar3;
  ulong uVar4;
  ulong uVar5;
  
  uVar2 = (long)c->len / 2;
  pUVar1 = c->list;
  uVar4 = 0;
  uVar5 = uVar2 & 0xffffffff;
  if ((int)uVar2 < 1) {
    uVar5 = uVar4;
  }
  do {
    if (uVar5 == uVar4) {
      UVar3 = UVector::containsNone(this->strings,c->strings);
      return UVar3 != '\0';
    }
    UVar3 = containsNone(this,pUVar1[uVar4 * 2],pUVar1[uVar4 * 2 + 1] + -1);
    uVar4 = uVar4 + 1;
  } while (UVar3 != '\0');
  return '\0';
}

Assistant:

UBool UnicodeSet::containsNone(const UnicodeSet& c) const {
    // The specified set is a subset if all of its pairs are contained in
    // this set.  It's possible to code this more efficiently in terms of
    // direct manipulation of the inversion lists if the need arises.
    int32_t n = c.getRangeCount();
    for (int32_t i=0; i<n; ++i) {
        if (!containsNone(c.getRangeStart(i), c.getRangeEnd(i))) {
            return FALSE;
        }
    }
    if (!strings->containsNone(*c.strings)) return FALSE;
    return TRUE;
}